

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall args::ArgumentParser::Help(ArgumentParser *this,ostream *help_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  ArgumentParser *pAVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  ArgumentParser *pAVar8;
  ostream *poVar9;
  pointer ptVar10;
  long lVar11;
  pointer extraout_RAX;
  long *plVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  long *plVar13;
  size_type *psVar14;
  pointer pbVar15;
  size_type sVar16;
  const_iterator __begin3;
  undefined8 uVar17;
  HelpParams *pHVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prognameline;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  proglines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandProgLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  epilog_text;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  description_text;
  undefined7 in_stack_fffffffffffffeb8;
  char in_stack_fffffffffffffebf;
  string local_140;
  byte local_11e;
  byte local_11d;
  undefined4 local_11c;
  HelpParams *local_118;
  undefined1 local_110 [24];
  long lStack_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  pointer local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  pAVar4 = this;
  do {
    pAVar8 = pAVar4;
    pAVar4 = (ArgumentParser *)(pAVar8->super_Command).selectedCommand;
  } while (pAVar4 != (ArgumentParser *)0x0);
  Wrap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&local_48,
       &(pAVar8->super_Command).help + ((pAVar8->super_Command).description._M_string_length != 0),
       (ulong)((this->helpParams).width - (this->helpParams).descriptionindent),0);
  Wrap(&local_60,&(pAVar8->super_Command).epilog,
       (ulong)((this->helpParams).width - (this->helpParams).descriptionindent),0);
  iVar6 = (*(pAVar8->super_Command).super_Group.super_Base._vptr_Base[10])(pAVar8);
  iVar7 = (*(pAVar8->super_Command).super_Group.super_Base._vptr_Base[0xb])(pAVar8);
  local_11d = (byte)iVar7;
  local_b8._M_allocated_capacity = 0;
  local_b8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_b8,&(this->helpParams).usageString);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_b8,&(this->helpParams).programName);
  (*(pAVar8->super_Command).super_Group.super_Base._vptr_Base[0xd])
            (&local_78,pAVar8,&this->helpParams);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
             local_b8._8_8_,
             local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_11e = (byte)iVar6;
  uVar2 = (this->helpParams).width;
  uVar3 = (this->helpParams).progindent;
  end._M_current._0_4_ = uVar2 - ((this->helpParams).progtailindent + uVar3);
  end._M_current._4_4_ = 0;
  local_118 = &this->helpParams;
  Wrap<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_98,(args *)local_b8._M_allocated_capacity,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_b8._8_8_,end,(ulong)(uVar2 - uVar3),0,
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  if (local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_140.field_2;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_140,(char)(this->helpParams).progindent);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (help_,local_140._M_dataplus._M_p,local_140._M_string_length);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,((local_98.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (local_98.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    local_110[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_110,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    pbVar15 = local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
    if (pbVar15 !=
        local_98.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_140._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_140,(char)(this->helpParams).progtailindent);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (help_,local_140._M_dataplus._M_p,local_140._M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pbVar15->_M_dataplus)._M_p,pbVar15->_M_string_length);
        local_110[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_110,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 !=
               local_98.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  local_140._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(help_,(char *)&local_140,1);
  if (local_48._M_allocated_capacity != local_48._8_8_) {
    uVar17 = local_48._M_allocated_capacity;
    do {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_140,(char)(this->helpParams).descriptionindent);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (help_,local_140._M_dataplus._M_p,local_140._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,*(char **)uVar17,*(undefined8 *)(uVar17 + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      uVar17 = uVar17 + 0x20;
    } while (uVar17 != local_48._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(help_,"\n",1);
  }
  if ((this->helpParams).optionsString._M_string_length != 0) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_140,(char)(this->helpParams).progindent);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (help_,local_140._M_dataplus._M_p,local_140._M_string_length);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(this->helpParams).optionsString._M_dataplus._M_p,
                        (this->helpParams).optionsString._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
  }
  (*(pAVar8->super_Command).super_Group.super_Base._vptr_Base[4])(local_110,pAVar8,local_118);
  local_80 = (pointer)local_110._8_8_;
  if (local_110._0_8_ == local_110._8_8_) {
    local_11c = 0;
  }
  else {
    paVar1 = &local_140.field_2;
    ptVar10 = (pointer)local_110._8_8_;
    pHVar18 = (HelpParams *)local_110._0_8_;
    do {
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&(pHVar18->shortPrefix)._M_string_length)->_M_allocated_capacity == 0) {
        local_11c = (undefined4)
                    CONCAT71((int7)((ulong)ptVar10 >> 8),
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)&pHVar18->flagindent)->_M_allocated_capacity == 0);
      }
      else {
        local_11c = 0;
      }
      iVar6 = (this->helpParams).eachgroupindent * *(int *)&((_Alloc_hider *)&pHVar18->width)->_M_p;
      Wrap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d8,&pHVar18->shortPrefix,
           (ulong)((this->helpParams).width -
                  ((this->helpParams).flagindent + (this->helpParams).helpindent +
                  (this->helpParams).gutter)),0);
      local_118 = pHVar18;
      Wrap(&local_f0,(string *)&pHVar18->progtailindent,
           (ulong)((this->helpParams).width - ((this->helpParams).helpindent + iVar6)),0);
      cVar5 = (char)iVar6;
      pbVar15 = (pointer)local_d8._0_8_;
      if (local_d8._0_8_ == local_d8._8_8_) {
        lVar11 = 0;
      }
      else {
        do {
          if (pbVar15 != (pointer)local_d8._0_8_) {
            local_140._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(help_,(char *)&local_140,1);
          }
          local_140._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_140,(char)(this->helpParams).flagindent + cVar5);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (help_,local_140._M_dataplus._M_p,local_140._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,(pbVar15->_M_dataplus)._M_p,pbVar15->_M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != paVar1) {
            operator_delete(local_140._M_dataplus._M_p);
          }
          if (pbVar15->_M_string_length == 0) {
            lVar11 = 0;
          }
          else {
            sVar16 = 0;
            lVar11 = 0;
            do {
              lVar11 = lVar11 + 1;
              sVar16 = sVar16 + 1;
            } while (pbVar15->_M_string_length != sVar16);
          }
          pbVar15 = pbVar15 + 1;
        } while (pbVar15 != (pointer)local_d8._8_8_);
      }
      pbVar15 = local_f0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = (this->helpParams).helpindent;
      lVar11 = (ulong)(this->helpParams).flagindent + lVar11;
      if ((((ulong)(this->helpParams).gutter + lVar11 <= (ulong)uVar2) &&
          (local_f0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_f0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) &&
         ((this->helpParams).addNewlineBeforeDescription != true)) {
        local_140._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_140,(char)uVar2 - (char)lVar11);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (help_,local_140._M_dataplus._M_p,local_140._M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pbVar15->_M_dataplus)._M_p,pbVar15->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&stack0xfffffffffffffebf,1);
        goto LAB_001a2c11;
      }
      local_140._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(help_,(char *)&local_140,1);
      for (; pbVar15 !=
             local_f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
        local_140._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_140,(char)(this->helpParams).helpindent + cVar5);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (help_,local_140._M_dataplus._M_p,local_140._M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pbVar15->_M_dataplus)._M_p,pbVar15->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,&stack0xfffffffffffffebf,1);
LAB_001a2c11:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d8);
      pHVar18 = (HelpParams *)&local_118->longPrefix;
      ptVar10 = extraout_RAX;
    } while (pHVar18 != (HelpParams *)local_80);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_110);
  if (((local_11e & local_11d) == 0) || ((this->helpParams).showTerminator != true)) {
    if ((char)local_11c != '\0') goto LAB_001a2e4b;
  }
  else {
    local_d8._0_8_ = (pointer)(local_d8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"\"","");
    plVar12 = (long *)std::__cxx11::string::_M_append
                                (local_d8,(ulong)(this->terminator)._M_dataplus._M_p);
    plVar13 = plVar12 + 2;
    if ((HelpParams *)*plVar12 == (HelpParams *)plVar13) {
      local_110._16_8_ = *plVar13;
      lStack_f8 = plVar12[3];
      local_110._0_8_ = (HelpParams *)(local_110 + 0x10);
    }
    else {
      local_110._16_8_ = *plVar13;
      local_110._0_8_ = (HelpParams *)*plVar12;
    }
    local_110._8_8_ = plVar12[1];
    *plVar12 = (long)plVar13;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append(local_110);
    paVar1 = &local_140.field_2;
    psVar14 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140.field_2._8_8_ = plVar12[3];
      local_140._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_140.field_2._M_allocated_capacity = *psVar14;
      local_140._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_140._M_string_length = plVar12[1];
    *plVar12 = (long)psVar14;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    Wrap(&local_f0,&local_140,(ulong)((this->helpParams).width - (this->helpParams).flagindent),0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p);
    }
    if ((HelpParams *)local_110._0_8_ != (HelpParams *)(local_110 + 0x10)) {
      operator_delete((void *)local_110._0_8_);
    }
    if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_);
    }
    if (local_f0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_f0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar15 = local_f0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_140._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_140,(char)(this->helpParams).flagindent);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (help_,local_140._M_dataplus._M_p,local_140._M_string_length);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pbVar15->_M_dataplus)._M_p,pbVar15->_M_string_length);
        local_110[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_110,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar1) {
          operator_delete(local_140._M_dataplus._M_p);
        }
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 !=
               local_f0.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(help_,"\n",1);
LAB_001a2e4b:
  if (local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar15 = local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_140,(char)(this->helpParams).descriptionindent);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (help_,local_140._M_dataplus._M_p,local_140._M_string_length);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(pbVar15->_M_dataplus)._M_p,pbVar15->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      pbVar15 = pbVar15 + 1;
    } while (pbVar15 !=
             local_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  return;
}

Assistant:

void Help(std::ostream &help_) const
            {
                auto &command = SelectedCommand();
                const auto &commandDescription = command.Description().empty() ? command.Help() : command.Description();
                const auto description_text = Wrap(commandDescription, helpParams.width - helpParams.descriptionindent);
                const auto epilog_text = Wrap(command.Epilog(), helpParams.width - helpParams.descriptionindent);

                const bool hasoptions = command.HasFlag();
                const bool hasarguments = command.HasPositional();

                std::vector<std::string> prognameline;
                prognameline.push_back(helpParams.usageString);
                prognameline.push_back(Prog());
                auto commandProgLine = command.GetProgramLine(helpParams);
                prognameline.insert(prognameline.end(), commandProgLine.begin(), commandProgLine.end());

                const auto proglines = Wrap(prognameline.begin(), prognameline.end(),
                                            helpParams.width - (helpParams.progindent + helpParams.progtailindent),
                                            helpParams.width - helpParams.progindent);
                auto progit = std::begin(proglines);
                if (progit != std::end(proglines))
                {
                    help_ << std::string(helpParams.progindent, ' ') << *progit << '\n';
                    ++progit;
                }
                for (; progit != std::end(proglines); ++progit)
                {
                    help_ << std::string(helpParams.progtailindent, ' ') << *progit << '\n';
                }

                help_ << '\n';

                if (!description_text.empty())
                {
                    for (const auto &line: description_text)
                    {
                        help_ << std::string(helpParams.descriptionindent, ' ') << line << "\n";
                    }
                    help_ << "\n";
                }

                bool lastDescriptionIsNewline = false;

                if (!helpParams.optionsString.empty())
                {
                    help_ << std::string(helpParams.progindent, ' ') << helpParams.optionsString << "\n\n";
                }

                for (const auto &desc: command.GetDescription(helpParams, 0))
                {
                    lastDescriptionIsNewline = std::get<0>(desc).empty() && std::get<1>(desc).empty();
                    const auto groupindent = std::get<2>(desc) * helpParams.eachgroupindent;
                    const auto flags = Wrap(std::get<0>(desc), helpParams.width - (helpParams.flagindent + helpParams.helpindent + helpParams.gutter));
                    const auto info = Wrap(std::get<1>(desc), helpParams.width - (helpParams.helpindent + groupindent));

                    std::string::size_type flagssize = 0;
                    for (auto flagsit = std::begin(flags); flagsit != std::end(flags); ++flagsit)
                    {
                        if (flagsit != std::begin(flags))
                        {
                            help_ << '\n';
                        }
                        help_ << std::string(groupindent + helpParams.flagindent, ' ') << *flagsit;
                        flagssize = Glyphs(*flagsit);
                    }

                    auto infoit = std::begin(info);
                    // groupindent is on both sides of this inequality, and therefore can be removed
                    if ((helpParams.flagindent + flagssize + helpParams.gutter) > helpParams.helpindent || infoit == std::end(info) || helpParams.addNewlineBeforeDescription)
                    {
                        help_ << '\n';
                    } else
                    {
                        // groupindent is on both sides of the minus sign, and therefore doesn't actually need to be in here
                        help_ << std::string(helpParams.helpindent - (helpParams.flagindent + flagssize), ' ') << *infoit << '\n';
                        ++infoit;
                    }
                    for (; infoit != std::end(info); ++infoit)
                    {
                        help_ << std::string(groupindent + helpParams.helpindent, ' ') << *infoit << '\n';
                    }
                }
                if (hasoptions && hasarguments && helpParams.showTerminator)
                {
                    lastDescriptionIsNewline = false;
                    for (const auto &item: Wrap(std::string("\"") + terminator + "\" can be used to terminate flag options and force all following arguments to be treated as positional options", helpParams.width - helpParams.flagindent))
                    {
                        help_ << std::string(helpParams.flagindent, ' ') << item << '\n';
                    }
                }

                if (!lastDescriptionIsNewline)
                {
                    help_ << "\n";
                }

                for (const auto &line: epilog_text)
                {
                    help_ << std::string(helpParams.descriptionindent, ' ') << line << "\n";
                }
            }